

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinity.cpp
# Opt level: O2

int set_thread_affinity(native_handle_type thread,uint *cpuid)

{
  uint uVar1;
  int iVar2;
  cpu_set_t cs;
  
  cs.__bits[0xe] = 0;
  cs.__bits[0xf] = 0;
  cs.__bits[0xc] = 0;
  cs.__bits[0xd] = 0;
  cs.__bits[10] = 0;
  cs.__bits[0xb] = 0;
  cs.__bits[8] = 0;
  cs.__bits[9] = 0;
  cs.__bits[6] = 0;
  cs.__bits[7] = 0;
  cs.__bits[4] = 0;
  cs.__bits[5] = 0;
  cs.__bits[2] = 0;
  cs.__bits[3] = 0;
  cs.__bits[0] = 0;
  cs.__bits[1] = 0;
  uVar1 = *cpuid;
  if (uVar1 < 0x400) {
    cs.__bits[uVar1 >> 6] = cs.__bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
  }
  iVar2 = pthread_setaffinity_np(thread,0x80,(cpu_set_t *)&cs);
  return iVar2;
}

Assistant:

int
set_thread_affinity(std::thread::native_handle_type thread,
        const unsigned &cpuid)
{
    int rc = -1;
#ifdef __APPLE__
    thread_port_t mach_thread;
    thread_affinity_policy_data_t policy = { static_cast<integer_t>(cpuid) };
    mach_thread = pthread_mach_thread_np(thread);
    rc = thread_policy_set(mach_thread, THREAD_AFFINITY_POLICY,
            (thread_policy_t)&policy, 1);
#elif defined(_WIN32) || defined(__CYGWIN__)
    rc = SetThreadAffinityMask(reinterpret_cast<HANDLE>(thread), 1ULL << cpuid) == 0 ? -2 : 0;
#elif !defined(__OpenBSD__) && !defined(__FreeBSD__) && !defined(__ANDROID__) && !defined(__NetBSD__)
    cpu_set_t cs;
    CPU_ZERO(&cs);
    CPU_SET(cpuid, &cs);
    rc = pthread_setaffinity_np(thread, sizeof(cpu_set_t), &cs);
#endif
    return rc;
}